

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

mcu8str * mcplcfg_show_item_lookup(mcu8str *__return_storage_ptr__,nccfgstate *state,char *item)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  
  bVar1 = *item;
  if (bVar1 < 0x6c) {
    if (bVar1 == 0x62) {
      iVar2 = strncmp(item,"bindir",7);
      if (iVar2 == 0) {
        mcplcfg_init_bindir(state);
        mcu8str_copy(__return_storage_ptr__,&state->bindir);
        return __return_storage_ptr__;
      }
      iVar2 = strncmp(item,"buildflags",0xb);
      if (iVar2 == 0) {
        mcplcfg_buildflags(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      iVar2 = strncmp(item,"build_type",0xb);
      if (iVar2 == 0) {
        pcVar3 = "Release";
        goto LAB_00101c8c;
      }
    }
    else if (bVar1 == 99) {
      iVar2 = strncmp(item,"cmakedir",9);
      if (iVar2 == 0) {
        mcplcfg_init_bindir(state);
        pcVar3 = "../lib/cmake/MCPL";
LAB_00101cb2:
        mcplcfg_resolverelpath(__return_storage_ptr__,&state->bindir,pcVar3);
        return __return_storage_ptr__;
      }
    }
    else if (bVar1 == 0x69) {
      iVar2 = strncmp(item,"intversion",0xb);
      if (iVar2 == 0) {
        pcVar3 = "2000000";
        goto LAB_00101c8c;
      }
      iVar2 = strncmp(item,"includedir",0xb);
      if (iVar2 == 0) {
        mcplcfg_init_bindir(state);
        pcVar3 = "../include";
        goto LAB_00101cb2;
      }
    }
  }
  else {
    if (bVar1 == 0x6c) {
      iVar2 = strncmp(item,"libpath",8);
      if (iVar2 == 0) {
        mcplcfg_libpath(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      iVar2 = strncmp(item,"libdir",7);
      if (iVar2 == 0) {
        mcplcfg_init_bindir(state);
        pcVar3 = "../lib";
        goto LAB_00101cb2;
      }
      pcVar3 = "libname";
      __n = 8;
    }
    else {
      if (bVar1 == 0x76) {
        iVar2 = strncmp(item,"version",8);
        if (iVar2 == 0) {
          pcVar3 = "2.0.0";
          goto LAB_00101c8c;
        }
        goto LAB_00101c3e;
      }
      if (bVar1 != 0x73) goto LAB_00101c3e;
      iVar2 = strncmp(item,"shlibpath",10);
      if (iVar2 == 0) {
        mcplcfg_shlibpath(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      iVar2 = strncmp(item,"shlibdir",9);
      if (iVar2 == 0) {
        mcplcfg_shlibdir(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      pcVar3 = "shlibname";
      __n = 10;
    }
    iVar2 = strncmp(item,pcVar3,__n);
    if (iVar2 == 0) {
      pcVar3 = "libmcpl.so";
LAB_00101c8c:
      mcu8str_view_cstr(__return_storage_ptr__,pcVar3);
      return __return_storage_ptr__;
    }
  }
LAB_00101c3e:
  __return_storage_ptr__->c_str = (char *)0x0;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  __return_storage_ptr__->owns_memory = 0;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcplcfg_show_item_lookup( nccfgstate* state,
                                const char* item )
{
  //Lookup string value of named item. Returns invalid string (with
  //c_str=nullptr) in case name not recognised. Synchronize with implementation
  //of mcplcfg_show_item_list function).

  //All options (libpath first since it might be used by e.g. the python
  //modules):
  if ( MCPLCFG_STREQUALCONST(item,"shlibpath") )
    return mcplcfg_shlibpath(state);

  if ( MCPLCFG_STREQUALCONST(item,"libpath") )
    return mcplcfg_libpath(state);

  /* if ( MCPLCFG_STREQUALCONST(item,"namespace") ) */
  /*   return mcu8str_view_cstr(mcplcfg_const_namespace()); */

  if ( MCPLCFG_STREQUALCONST(item,"version") )
    return mcu8str_view_cstr(mcplcfg_const_version());

  if ( MCPLCFG_STREQUALCONST(item,"intversion") )
    return mcu8str_view_cstr(mcplcfg_const_intversion());

  if ( MCPLCFG_STREQUALCONST(item,"bindir") )
    return mcplcfg_bindir(state);

  if ( MCPLCFG_STREQUALCONST(item,"libdir") )
    return mcplcfg_libdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"shlibdir") )
    return mcplcfg_shlibdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"includedir") )
    return mcplcfg_incdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"buildflags") )
    return mcplcfg_buildflags( state );

  if ( MCPLCFG_STREQUALCONST(item,"libname") )
    return mcu8str_view_cstr(mcplcfg_const_libname());

  if ( MCPLCFG_STREQUALCONST(item,"shlibname") )
    return mcu8str_view_cstr(mcplcfg_const_shlibname());

  if ( MCPLCFG_STREQUALCONST(item,"cmakedir") )
    return mcplcfg_cmakedir(state);

  if ( MCPLCFG_STREQUALCONST(item,"build_type") )
    return mcu8str_view_cstr(mcplcfg_const_cmakebuildtype());

  //Get here on errors:
  mcu8str error;
  error.c_str = NULL;
  error.size = error.buflen = 0;
  error.owns_memory = 0;
  return error;
}